

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
sophia_interface::LUKFDI
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,sophia_interface *this,int KFL1
          ,int KFL2)

{
  bool bVar1;
  bool bVar2;
  int KT3_1;
  uint uVar3;
  int iVar4;
  uint uVar5;
  sophia_interface *psVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  sophia_interface *psVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  sophia_interface *psVar18;
  string *this_00;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  sophia_interface *psVar22;
  ulong uVar23;
  sophia_interface *psVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<double> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  undefined1 local_170 [32];
  undefined1 local_150 [40];
  double local_128;
  double local_120;
  ulong local_118;
  double local_110;
  undefined1 local_108 [16];
  sophia_interface *local_f8;
  double local_f0;
  double local_e8;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  double local_c0;
  sophia_interface *local_b8;
  sophia_interface *local_b0;
  sophia_interface *local_a8;
  double local_a0;
  double local_98;
  uint local_8c;
  double local_88;
  vector<int,_std::allocator<int>_> *local_80;
  double local_78;
  double local_70;
  ulong local_68;
  uint local_5c;
  double local_58;
  char local_4d;
  int local_4c;
  uint local_48;
  uint local_44;
  sophia_interface *local_40;
  int local_38;
  uint local_34 [2];
  int KF;
  
  local_44 = 0;
  local_34[0] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar22 = (sophia_interface *)(ulong)(uint)-KFL1;
  if (0 < KFL1) {
    psVar22 = (sophia_interface *)(ulong)(uint)KFL1;
  }
  local_48 = (uint)psVar22;
  local_68 = (ulong)(uint)-KFL2;
  if (0 < KFL2) {
    local_68 = (ulong)(uint)KFL2;
  }
  local_80 = __return_storage_ptr__;
  local_38 = KFL1;
  if ((KFL1 == 0) ||
     ((KFL2 != 0 &&
      (((((uint)local_68 < 0xb && local_48 < 0xb) && 0 < KFL2 * KFL1 ||
        (10 < local_48 && 10 < (uint)local_68)) ||
       (KFL2 * KFL1 < 0 && (10 < local_48 || 10 < (uint)local_68))))))) {
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict2 *)&local_44);
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict2 *)local_34);
    return __return_storage_ptr__;
  }
  local_5c = ~KFL1;
  local_4c = KFL2;
  if (MSTJ[0xe] != 1) goto LAB_00125cbf;
  uVar19 = 0xffffffff;
  if (local_48 < 7) {
    uVar19 = local_48;
  }
  psVar18 = (sophia_interface *)0x0;
  psVar6 = (sophia_interface *)(((ulong)psVar22 / 1000) % 10);
  iVar8 = (int)psVar6;
  uVar23 = ((ulong)psVar22 / 100) % 10;
  iVar9 = (int)uVar23;
  if ((iVar9 - 1U | iVar8 - 1U) < 4) {
    uVar19 = (uint)(byte)((char)((char)((ulong)psVar22 % 10) + -1) / '\x02') +
             (iVar8 + -2) * iVar8 + iVar9 * 2 + 6;
  }
  uVar19 = uVar19 - (iVar8 == iVar9 && iVar8 - 1U < 4);
  if (local_48 < 7) {
    psVar6 = psVar22;
  }
  if (KFL2 != 0) {
    uVar16 = 0xffffffff;
    if ((uint)local_68 < 7) {
      uVar16 = (uint)local_68;
    }
    iVar9 = (int)((local_68 / 1000) % 10);
    iVar8 = (int)((local_68 / 100) % 10);
    if (iVar8 - 1U < 4 && iVar9 - 1U < 4) {
      uVar16 = (uint)(byte)((char)((char)(local_68 % 10) + -1) / '\x02') +
               (iVar9 + -2) * iVar9 + iVar8 * 2 + 6;
    }
    psVar18 = (sophia_interface *)(ulong)(uVar16 - (iVar9 == iVar8 && iVar9 - 1U < 4));
  }
  if ((int)uVar19 < 0) goto LAB_00125cbf;
  iVar9 = (int)psVar18;
  if (iVar9 < 0) goto LAB_00125cbf;
  psVar22 = (sophia_interface *)0x1;
  psVar24 = (sophia_interface *)0x6;
  if ((iVar9 != 0 || 0 < MSTJ[0xb]) && ((uVar19 < 7 || iVar9 != 0) || 1 < MSTJ[0xb])) {
    psVar22 = (sophia_interface *)(ulong)(iVar9 + (uint)(iVar9 == 0));
    psVar24 = (sophia_interface *)0x16;
    if (iVar9 != 0) {
      psVar24 = psVar18;
    }
  }
  uVar16 = uVar19 * 0x50;
  local_c8 = (ulong)uVar16;
  iVar9 = uVar16 + 0x77;
  local_78 = 0.0;
  for (iVar8 = 0; psVar12 = psVar22, iVar8 != 3; iVar8 = iVar8 + 1) {
    for (; psVar12 <= psVar24; psVar12 = (sophia_interface *)((long)&psVar12->N + 1)) {
      local_78 = local_78 + PARF[iVar9 + (int)psVar12];
    }
    iVar9 = iVar9 + 0x19;
  }
  uVar21 = 0;
  local_70 = (double)(ulong)uVar19;
  local_58 = (double)uVar23;
  local_40 = psVar6;
  dVar26 = RLU(psVar18,false);
  uVar19 = local_48;
  __return_storage_ptr__ = local_80;
  dVar26 = local_78 * dVar26;
  iVar9 = uVar16 + 0x77;
  dVar27 = 0.0;
  dVar28 = 0.0;
  while( true ) {
    uVar16 = (uint)uVar21;
    psVar6 = psVar22;
    if (SUB84(dVar28,0) == 3) break;
    while (dVar27 = dVar28, psVar6 <= psVar24) {
      uVar21 = (ulong)psVar6 & 0xffffffff;
      dVar26 = dVar26 - PARF[iVar9 + (int)psVar6];
      psVar6 = (sophia_interface *)((long)&psVar6->N + 1);
      if (dVar26 <= 0.0) {
        uVar16 = (int)psVar6 - 1;
        goto LAB_00125967;
      }
    }
    iVar9 = iVar9 + 0x19;
    dVar28 = (double)(ulong)(SUB84(dVar28,0) + 1);
  }
LAB_00125967:
  uVar11 = SUB84(local_70,0);
  if ((int)uVar16 < 7) {
    iVar9 = uVar11 * 2 + -0xd;
    uVar3 = 0;
    uVar10 = uVar16;
    uVar14 = uVar16;
  }
  else {
    uVar3 = 3;
    if (uVar16 < 0xb) {
      uVar3 = (uVar16 != 7) + 1;
    }
    uVar10 = 4;
    if (uVar16 < 0x10) {
      uVar10 = uVar3;
    }
    iVar9 = (uVar10 - 2) * uVar10;
    uVar3 = (int)((uVar16 - iVar9) + -6) / 2;
    uVar14 = uVar3 * 100 + uVar10 * 1000;
    if ((uVar10 == uVar3) || (uVar16 != iVar9 + uVar3 * 2 + 6)) {
      uVar14 = uVar14 | 3;
    }
    else {
      uVar14 = uVar14 | 1;
    }
    iVar9 = uVar11 * -2 + 0xd;
  }
  local_44 = -uVar14;
  if (-1 < iVar9 * local_38) {
    local_44 = uVar14;
  }
  uVar17 = (uint)local_40;
  uVar14 = SUB84(local_58,0);
  iVar9 = SUB84(dVar27,0);
  psVar6 = local_40;
  if (((uVar10 == uVar17) && (uVar3 == uVar14)) && (uVar17 < 4 || uVar14 != 0)) {
    dVar27 = RLU(local_40,false);
    iVar4 = iVar9 * 0x19;
    iVar8 = (int)local_c8;
    dVar28 = PARF[iVar4 + 0x8f + iVar8] + PARF[iVar4 + iVar8 + 0x8e];
    dVar27 = (PARF[iVar4 + 0x90 + iVar8] + dVar28) * dVar27;
    psVar22 = (sophia_interface *)(ulong)local_48;
    if ((PARF[iVar4 + iVar8 + 0x8e] < dVar27) || (local_34[0] = iVar9 * 2 + 0x6f, dVar28 < dVar27))
    {
      local_34[0] = iVar9 * 2 + 0x14b;
      if (dVar27 <= dVar28) {
        local_34[0] = iVar9 * 2 + 0xdd;
      }
    }
    goto LAB_00125c56;
  }
  if (((int)uVar11 < 7) && ((int)uVar16 < 7)) {
    uVar3 = uVar11;
    if ((int)uVar16 < (int)uVar11) {
      uVar3 = uVar16;
      uVar16 = uVar11;
    }
    iVar8 = uVar3 * 10 + uVar16 * 100 + iVar9 * 2 + 1;
    iVar9 = -iVar8;
    if ((uVar16 == local_48) == -1 < local_38) {
      iVar9 = iVar8;
    }
LAB_00125c3d:
    local_40 = (sophia_interface *)(double)iVar9;
    dVar27 = pow(-1.0,(double)(int)uVar16);
    local_34[0] = (int)(dVar27 * (double)local_40);
LAB_00125c53:
    psVar22 = (sophia_interface *)(ulong)uVar19;
LAB_00125c56:
    KFL2 = local_4c;
    if (local_4c != 0) {
      local_44 = 0;
    }
    iVar9 = LUCOMP(psVar6,local_34[0]);
    if (iVar9 != 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict2 *)&local_44);
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict2 *)local_34);
      return __return_storage_ptr__;
    }
    psVar6 = (sophia_interface *)local_150;
    std::__cxx11::string::string
              ((string *)psVar6,"LUKFDI: user-defined flavour probabilities failed",
               (allocator *)local_108);
    LUERRM(psVar6,2,(string *)local_150);
    this_00 = (string *)local_150;
  }
  else {
    psVar22 = (sophia_interface *)(ulong)local_48;
    if (((int)uVar11 < 7) || ((int)uVar16 < 7)) {
      uVar16 = uVar17;
      uVar5 = uVar10;
      if (6 < (int)uVar11) {
        uVar3 = uVar14;
        uVar16 = uVar10;
        uVar5 = uVar17;
      }
      local_108._4_4_ = uVar5;
      local_108._0_4_ = uVar16;
      __l._M_len = 3;
      __l._M_array = (iterator)local_108;
      local_78 = dVar27;
      local_108._8_4_ = uVar3;
      iVar9 = std::max<int>(__l);
      local_58 = (double)CONCAT44(extraout_var,iVar9);
      psVar6 = (sophia_interface *)local_108;
      local_108._8_4_ = uVar3;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)psVar6;
      iVar9 = std::min<int>(__l_00);
      iVar4 = SUB84(local_58,0);
      iVar8 = ((uVar10 + (int)local_40 + uVar3) - iVar4) - iVar9;
      iVar20 = SUB84(local_78,0);
      __return_storage_ptr__ = local_80;
      if (iVar20 == 0) {
        iVar9 = iVar9 * 100 + iVar4 * 1000;
        iVar8 = iVar8 * 10;
        local_34[0] = iVar9 + iVar8 ^ 0xfffffffe;
        if (-1 < local_38) {
          local_34[0] = iVar9 + iVar8 + 2;
        }
      }
      else if (0 < iVar20) {
        uVar16 = iVar4 * 1000 + iVar20 * 2 + iVar9 * 10 + iVar8 * 100;
        local_34[0] = -uVar16;
        if (-1 < local_38) {
          local_34[0] = uVar16;
        }
        goto LAB_00125c53;
      }
      goto LAB_00125c56;
    }
    uVar16 = (int)local_5c >> 0x1f | 1;
    uVar11 = local_38 >> 0x1f | 1;
    if (uVar10 == uVar17) {
      uVar5 = uVar14;
      if ((int)uVar3 < (int)uVar14) {
        uVar5 = uVar3;
      }
      local_40 = (sophia_interface *)(ulong)uVar3;
      if ((int)uVar3 < (int)uVar14) {
        local_40 = (sophia_interface *)((ulong)local_58 & 0xffffffff);
      }
      if ((int)uVar14 < (int)uVar3) {
        uVar11 = uVar16;
      }
LAB_00125c1f:
      uVar16 = (uint)local_40;
      psVar6 = local_40;
      iVar9 = (uVar16 * 100 + uVar5 * 10 + iVar9 * 2 + 1) * uVar11;
      goto LAB_00125c3d;
    }
    uVar15 = uVar16;
    uVar13 = uVar10;
    if (uVar17 == uVar3) {
LAB_00125be5:
      local_40 = (sophia_interface *)(ulong)uVar13;
      uVar5 = uVar14;
      uVar11 = uVar15;
      goto LAB_00125c1f;
    }
    uVar5 = uVar3;
    if (uVar14 == uVar10) goto LAB_00125c1f;
    if (uVar3 == uVar14) {
      uVar14 = uVar17;
      if ((int)uVar10 < (int)uVar17) {
        uVar13 = uVar17;
        uVar14 = uVar10;
      }
      uVar15 = uVar11;
      if ((int)uVar17 < (int)uVar10) {
        uVar15 = uVar16;
      }
      goto LAB_00125be5;
    }
    psVar6 = (sophia_interface *)local_170;
    std::__cxx11::string::string
              ((string *)psVar6,"LUKFDI: no matching flavours for qq -> qq",(allocator *)local_108);
    LUERRM(psVar6,2,(string *)local_170);
    this_00 = (string *)local_170;
    KFL2 = local_4c;
  }
  std::__cxx11::string::~string(this_00);
LAB_00125cbf:
  local_98 = PARJ[3] * 3.0;
  if (MSTJ[0xb] < 2) {
    local_120 = 0.0;
    local_b0 = (sophia_interface *)0x0;
    local_b8 = (sophia_interface *)0x0;
    local_a8 = (sophia_interface *)0x0;
    local_88 = 0.0;
    local_c0 = 0.0;
    local_70 = 0.0;
    local_a0 = PARJ[2];
    psVar6 = (sophia_interface *)PARJ[1];
  }
  else {
    local_40 = (sophia_interface *)PARJ[1];
    local_a0 = PARJ[2];
    if (PARJ[2] < 0.0) {
      local_70 = sqrt(PARJ[2]);
    }
    else {
      local_70 = SQRT(PARJ[2]);
    }
    if (PARJ[3] < 0.0) {
      dVar27 = sqrt(PARJ[3]);
    }
    else {
      dVar27 = SQRT(PARJ[3]);
    }
    local_c0 = 1.0 / (dVar27 * 3.0);
    dVar27 = local_c0 + 1.0;
    local_108._0_8_ = (((double)local_40 * local_70 * PARJ[6] + 1.0) * dVar27 + 2.0) * PARJ[4];
    local_108._8_8_ =
         (PARJ[5] * dVar27 + (double)local_40 * local_70 * PARJ[5] * PARJ[6]) * PARJ[4] +
         (PARJ[6] * (double)local_108._0_8_) / (local_70 + local_70);
    local_58 = PARJ[5];
    local_88 = PARJ[6];
    local_f8 = (sophia_interface *)
               (((double)local_40 * PARJ[6] + dVar27 / local_70) *
               (PARJ[4] + PARJ[4]) * PARJ[5] * PARJ[6]);
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)local_108;
    local_b8 = (sophia_interface *)local_108._8_8_;
    local_b0 = local_f8;
    local_a8 = (sophia_interface *)local_108._0_8_;
    local_120 = std::max<double>(__l_01);
    local_88 = local_88 / (local_58 * local_70 + local_88);
    local_98 = (local_98 * (local_120 + 1.0)) / (local_120 / (local_c0 * 3.0) + 1.0);
    psVar6 = local_40;
  }
  uVar19 = (uint)psVar22;
  local_dc = 0;
  if (uVar19 < 0x2711) {
    local_dc = uVar19;
  }
  local_e0 = 0;
  if ((uint)local_68 - 0xb < 0x2706) {
    local_e0 = (uint)local_68;
  }
  local_f0 = local_c0 * 3.0;
  local_4d = uVar19 < 0xb && KFL2 == 0;
  local_e8 = (double)psVar6 + 2.0;
  local_58 = (double)(((ulong)psVar22 / 1000) % 10);
  psVar18 = (sophia_interface *)0x64;
  local_118 = ((ulong)psVar22 / 100) % 10;
  local_cc = (uint)((ulong)psVar22 % 10);
  local_d8 = (uint)(((local_68 & 0xffffffff) / 1000) % 10);
  local_d4 = (uint)(((local_68 & 0xffffffff) / 100) % 10);
  local_d0 = (uint)((local_68 & 0xffffffff) % 10);
  local_a0 = local_a0 * (double)psVar6 + 2.0;
  local_110 = local_120 / local_f0 + 1.0;
  local_120 = local_120 + 1.0;
  local_5c = (int)local_5c >> 0x1f | 1;
  local_8c = local_38 >> 0x1f | 1;
  local_78 = (double)CONCAT44(local_78._4_4_,(int)local_118 - SUB84(local_58,0));
  local_70 = local_70 * (double)psVar6;
  local_c0 = local_c0 + 1.0;
  local_150._32_8_ = local_c0;
  if (local_c0 <= 2.0) {
    local_150._32_8_ = 2.0;
  }
  local_128 = 1.0 / local_c0;
  local_c0 = local_c0 / (double)local_150._32_8_;
  local_150._32_8_ = 2.0 / (double)local_150._32_8_;
  local_c8 = CONCAT44(local_c8._4_4_,SUB84(local_58,0) + (int)local_118);
LAB_00126068:
  do {
    if ((uint)psVar22 < 0xb) {
      iVar9 = 0;
      if (0 < MSTJ[0xb] && KFL2 == 0) {
        local_40 = (sophia_interface *)(PARJ[0] + 1.0);
        iVar9 = 0;
        dVar27 = RLU(psVar18,false);
        if (1.0 < dVar27 * (double)local_40) {
          iVar9 = 1;
        }
      }
      uVar19 = local_e0;
      if (10 < (uint)local_68) {
        iVar9 = 2;
      }
    }
    else {
      uVar19 = local_dc;
      iVar9 = 2;
    }
    if ((uVar19 != 0) && (1 < MSTJ[0xb])) {
      uVar11 = (uint)(((ulong)uVar19 / 1000) % 10);
      psVar18 = (sophia_interface *)(((ulong)uVar19 / 100) % 10);
      uVar3 = (uint)psVar18;
      uVar16 = uVar3;
      if (uVar3 < uVar11) {
        uVar16 = uVar11;
      }
      psVar22 = local_b8;
      if (uVar16 != 3) {
        psVar22 = local_a8;
      }
      if (uVar3 < uVar11) {
        uVar11 = uVar3;
      }
      local_40 = local_b0;
      if (uVar11 != 3) {
        local_40 = psVar22;
      }
      if (uVar19 % 10 == 1) {
        local_40 = (sophia_interface *)((double)local_40 / local_f0);
      }
      dVar27 = RLU(psVar18,false);
      dVar27 = ((double)local_40 + 1.0) * dVar27;
      if (1.0 < dVar27) {
        iVar9 = -1;
      }
      if ((KFL2 != 0) && (1.0 < dVar27)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)&local_44);
        std::vector<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)local_34);
        return __return_storage_ptr__;
      }
    }
    if (0 < iVar9) break;
    if (iVar9 == 0) {
      if (local_4c == 0) {
        dVar27 = RLU(psVar18,false);
        local_44 = ~(int)(dVar27 * local_e8);
        if (local_38 < 1) {
          local_44 = (int)(dVar27 * local_e8) + 1;
        }
      }
      uVar19 = -local_44;
      if (0 < (int)local_44) {
        uVar19 = local_44;
      }
      uVar19 = uVar19 + (uint)local_68;
      uVar11 = uVar19;
      uVar16 = local_48;
      if (uVar19 < local_48) {
        uVar11 = local_48;
        uVar16 = uVar19;
      }
      uVar3 = local_8c;
      if (local_48 < uVar19) {
        uVar3 = local_5c;
      }
    }
    else {
      do {
        while( true ) {
          dVar27 = RLU(psVar18,false);
          uVar19 = (int)(dVar27 + 0.5) * local_78._0_4_ + local_58._0_4_;
          uVar16 = (int)local_c8 - uVar19;
          if ((((uVar19 != 3) ||
               (dVar27 = RLU(psVar18,false), uVar10 = uVar16, uVar11 = uVar19, dVar27 <= local_88))
              && (uVar10 = uVar19, uVar11 = uVar16, uVar16 == 3)) &&
             (dVar27 = RLU(psVar18,false), uVar10 = uVar16, uVar11 = uVar19, local_88 <= dVar27)) {
            uVar10 = uVar19;
            uVar11 = 3;
          }
          local_40 = (sophia_interface *)(PARJ[6] * local_70);
          dVar27 = RLU(psVar18,false);
          iVar9 = (int)(((double)local_40 + 2.0) * dVar27);
          uVar19 = iVar9 + 1;
          dVar27 = RLU(psVar18,false);
          if (uVar11 != uVar19) break;
          if (dVar27 <= (double)local_150._32_8_) {
            iVar8 = 3;
            uVar19 = uVar11;
            goto LAB_001262a9;
          }
        }
      } while (local_c0 < dVar27);
      dVar27 = RLU(psVar18,false);
      iVar8 = (int)(dVar27 + local_128) * 2 + 1;
LAB_001262a9:
      uVar16 = uVar19;
      if ((int)uVar19 < (int)uVar11) {
        uVar16 = uVar11;
      }
      if ((int)uVar19 < (int)uVar11) {
        uVar11 = uVar19;
      }
      iVar4 = uVar11 * 100 + uVar16 * 1000;
      local_44 = iVar8 + 10000 + iVar4;
      if (0 < local_38) {
        local_44 = (-10000 - iVar4) - iVar8;
      }
      uVar16 = uVar19;
      uVar11 = uVar10;
      if ((int)uVar10 <= (int)uVar19) {
        uVar16 = uVar10;
        uVar11 = uVar19;
      }
      uVar3 = local_5c;
      if (iVar9 < (int)uVar10) {
        uVar3 = local_8c;
      }
    }
    lVar7 = (ulong)(uVar11 != 3) * 8 + 0x58;
    if ((int)uVar11 < 3) {
      lVar7 = 0x50;
    }
    local_40 = *(sophia_interface **)((long)PARJ + lVar7);
    dVar27 = RLU(psVar18,false);
    uVar19 = (uint)(dVar27 + (double)local_40);
    if ((uVar19 != 0) || (PARJ[0xd] <= 0.0)) {
      if ((uVar19 == 1) && (uVar19 = 1, 0.0 < PARJ[0xe] + PARJ[0xf] + PARJ[0x10])) {
        dVar27 = RLU(psVar18,false);
        uVar19 = 3;
        if (PARJ[0xe] <= dVar27) {
          uVar19 = 4;
          if ((PARJ[0xe] + PARJ[0xf] <= dVar27) &&
             (uVar19 = 1, dVar27 < PARJ[0xe] + PARJ[0xf] + PARJ[0x10])) {
            uVar19 = 5;
          }
        }
      }
    }
    else {
      uVar19 = 0;
      dVar27 = RLU(psVar18,false);
      if (dVar27 < PARJ[0xd]) {
        uVar19 = 2;
      }
    }
    iVar9 = (uVar19 != 3) + 1 + (uint)(uVar19 != 3);
    if (uVar19 == 0) {
      iVar9 = 1;
    }
    if (uVar19 == 5) {
      iVar9 = 5;
    }
    if (uVar11 == uVar16) {
      dVar27 = RLU(psVar18,false);
      if ((int)uVar16 < 4) {
        lVar7 = (long)(int)(uVar19 * 10 + uVar16 * 2);
        local_34[0] = ((int)(dVar27 + PMAS[3][lVar7 + 499]) + (int)(PMAS[3][lVar7 + 0x1f2] + dVar27)
                      ) * 0x6e + iVar9 + 0x6e;
      }
      psVar22 = (sophia_interface *)(ulong)local_48;
      if (3 < (int)uVar11) {
        local_34[0] = iVar9 + uVar16 * 0x6e;
      }
    }
    else {
      local_40 = (sophia_interface *)(double)(int)((uVar16 * 10 + uVar11 * 100 + iVar9) * uVar3);
      dVar27 = pow(-1.0,(double)(int)uVar11);
      local_34[0] = (uint)(dVar27 * (double)local_40);
      psVar22 = (sophia_interface *)(ulong)local_48;
    }
    KFL2 = local_4c;
    __return_storage_ptr__ = local_80;
    if ((uVar19 & 0xfffffffe) == 2) {
      uVar19 = local_34[0] - 10000;
      bVar25 = (int)local_34[0] < 0;
      local_34[0] = local_34[0] + 10000;
      if (bVar25) {
        local_34[0] = uVar19;
      }
    }
    else if (uVar19 == 4) {
      uVar19 = local_34[0] - 20000;
      bVar25 = (int)local_34[0] < 0;
      local_34[0] = local_34[0] + 20000;
      if (bVar25) {
        local_34[0] = uVar19;
      }
    }
    if (local_34[0] == 0x14b) {
      dVar27 = RLU(psVar18,false);
      if (dVar27 <= PARJ[0x19]) goto LAB_001268f7;
      goto LAB_00126068;
    }
    if ((local_34[0] != 0xdd) || (dVar27 = RLU(psVar18,false), dVar27 <= PARJ[0x18]))
    goto LAB_001268f7;
  } while( true );
  do {
    if (local_4d == '\0') {
      uVar16 = local_d4;
      uVar11 = local_d8;
      uVar3 = local_48;
      uVar19 = local_d0;
      if (10 < local_48) {
        if (local_4c == 0) {
          dVar27 = RLU(psVar18,false);
          local_44 = ~(int)(dVar27 * local_e8);
          if (-1 < local_38) {
            local_44 = (int)(dVar27 * local_e8) + 1;
          }
        }
        uVar19 = -local_44;
        if (0 < (int)local_44) {
          uVar19 = local_44;
        }
        uVar16 = (uint)local_118;
        uVar11 = SUB84(local_58,0);
        uVar3 = uVar19 + (uint)local_68;
        uVar19 = local_cc;
      }
    }
    else {
      do {
        while( true ) {
          dVar27 = RLU(psVar18,false);
          dVar27 = dVar27 * local_a0;
          dVar28 = RLU(psVar18,false);
          dVar28 = dVar28 * local_a0;
          dVar26 = RLU(psVar18,false);
          if ((int)dVar28 <= (int)dVar27) break;
          if (dVar26 * local_98 <= 1.0) {
            uVar19 = 1;
            goto LAB_00126613;
          }
        }
      } while (local_98 < dVar26);
      uVar19 = 3;
LAB_00126613:
      uVar11 = (int)dVar27 + 1;
      uVar16 = (int)dVar28 + 1;
      uVar3 = uVar16;
      if ((int)uVar16 < (int)uVar11) {
        uVar3 = uVar11;
      }
      uVar10 = uVar11;
      if ((int)uVar16 < (int)uVar11) {
        uVar10 = uVar16;
      }
      uVar10 = uVar10 * 100 + uVar3 * 1000 | uVar19;
      uVar3 = local_48;
      local_44 = -uVar10;
      if (-1 < local_38) {
        local_44 = uVar10;
      }
    }
    uVar10 = (uVar11 != uVar16) + 3 + (uint)(uVar11 != uVar16);
    if (uVar19 != 3) {
      uVar10 = uVar19;
    }
    uVar23 = (ulong)((uVar3 != uVar16 && uVar3 != uVar11) + uVar10);
    psVar22 = (sophia_interface *)(PARJ[0x11] * PARF[uVar23 + 0x45] + PARF[uVar23 + 0x3b]);
    local_70 = (double)CONCAT44(local_70._4_4_,uVar19);
    if ((iVar9 == 1) && (1 < MSTJ[0xb])) {
      uVar10 = uVar16;
      if ((int)uVar16 < (int)uVar11) {
        uVar10 = uVar11;
      }
      psVar6 = local_b8;
      if (uVar10 != 3) {
        psVar6 = local_a8;
      }
      uVar10 = uVar11;
      if ((int)uVar16 < (int)uVar11) {
        uVar10 = uVar16;
      }
      psVar24 = local_b0;
      if (uVar10 != 3) {
        psVar24 = psVar6;
      }
      if (uVar19 == 1) {
        psVar22 = (sophia_interface *)
                  (((double)psVar22 * ((double)psVar24 / local_f0 + 1.0)) / local_110);
        psVar24 = (sophia_interface *)((double)psVar24 / local_f0);
      }
      if (uVar19 == 3) {
        psVar22 = (sophia_interface *)((((double)psVar24 + 1.0) * (double)psVar22) / local_120);
      }
    }
  } while ((local_4c == 0) &&
          (local_40 = psVar22, dVar27 = RLU(psVar18,false), (double)local_40 < dVar27));
  local_108._4_4_ = uVar11;
  local_108._0_4_ = uVar3;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_108;
  local_108._8_4_ = uVar16;
  iVar9 = std::max<int>(__l_02);
  local_40 = (sophia_interface *)CONCAT44(extraout_var_00,iVar9);
  psVar22 = (sophia_interface *)local_108;
  local_108._8_4_ = uVar16;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)psVar22;
  uVar19 = std::min<int>(__l_03);
  local_78 = (double)CONCAT44(local_78._4_4_,uVar3);
  iVar8 = (int)local_40;
  iVar4 = ((uVar11 + uVar16 + uVar3) - iVar8) - uVar19;
  local_58 = PARJ[0x11] * PARF[uVar23 + 0x45] + PARF[uVar23 + 0x3b];
  dVar27 = RLU(psVar22,false);
  __return_storage_ptr__ = local_80;
  dVar27 = dVar27 * local_58;
  bVar25 = dVar27 != PARF[uVar23 + 0x3b];
  bVar1 = PARF[uVar23 + 0x3b] <= dVar27;
  bVar2 = bVar1 && bVar25;
  iVar9 = bVar2 + 2 + (uint)bVar2;
  if ((!bVar1 || !bVar25) && ((iVar4 < iVar8 && ((int)uVar19 < iVar4)))) {
    if (local_78._0_4_ == iVar8 || local_70._0_4_ != 1) {
      uVar16 = (uint)(local_70._0_4_ == 1 && local_78._0_4_ == iVar8);
      if ((local_70._0_4_ == 3) && (local_78._0_4_ != iVar8)) {
        local_58 = 0.75;
        goto LAB_001268b0;
      }
    }
    else {
      local_58 = 0.25;
LAB_001268b0:
      dVar27 = RLU((sophia_interface *)(ulong)uVar19,false);
      uVar16 = (uint)(dVar27 + local_58);
    }
    if (uVar16 == 1) {
      uVar19 = iVar4 * 10 + uVar19 * 100 + iVar8 * 1000 + iVar9;
      local_34[0] = -uVar19;
      if (-1 < local_38) {
        local_34[0] = uVar19;
      }
      goto LAB_001268f7;
    }
    if (uVar16 != 0) goto LAB_001268f7;
  }
  uVar19 = uVar19 * 10 + iVar8 * 1000 + iVar4 * 100 + iVar9;
  local_34[0] = -uVar19;
  if (-1 < local_38) {
    local_34[0] = uVar19;
  }
LAB_001268f7:
  std::vector<int,_std::allocator<int>_>::push_back
            (__return_storage_ptr__,(value_type_conflict2 *)&local_44);
  std::vector<int,_std::allocator<int>_>::push_back
            (__return_storage_ptr__,(value_type_conflict2 *)local_34);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> sophia_interface::LUKFDI(int KFL1, int KFL2) {
// Purpose: to generate a new flavour pair and combine off a hadron.
// Default flavour values. Input consistency checks.
// Returns vector (KFL3, KF).
    int KFL3 = 0;
    int KF = 0;
    std::vector<int> output;
    int KF1A = std::abs(KFL1);
    int KF2A = std::abs(KFL2);
    if (KF1A == 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    if (KF2A != 0) {
        if (KF1A <= 10 && KF2A <= 10 && KFL1 * KFL2 > 0) {output.push_back(KFL3); output.push_back(KF); return output;}
        if (KF1A > 10 && KF2A > 10) {output.push_back(KFL3); output.push_back(KF); return output;}
        if ((KF1A > 10 || KF2A > 10) && KFL1 * KFL2 < 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    }

    // Check if tabulated flavour probabilities are to be used. 
    bool skip = false;
    int KTAB1 = 0;
    int KTAB2 = 0;
    int KFL1A = 0;
    int KFL1B = 0;
    if (MSTJ[14] == 1) {
        KTAB1 = -1;
        if ((KF1A >= 1) && (KF1A <= 6)) KTAB1 = KF1A;
        KFL1A = (KF1A / 1000) % 10;
        KFL1B = (KF1A / 100) % 10;
        int KFL1S = KF1A % 10;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1B >= 1 && KFL1B <= 4) KTAB1 = 6 + KFL1A * (KFL1A - 2) + 2 * KFL1B + (KFL1S - 1) / 2;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1A == KFL1B) KTAB1--;
        if (KF1A >= 1 && KF1A <= 6) KFL1A = KF1A;
        KTAB2 = 0;
        if (KF2A != 0) {
            KTAB2 = -1;
            if (KF2A >= 1 && KF2A <= 6) KTAB2 = KF2A;
            int KFL2A = (KF2A / 1000) % 10;
            int KFL2B = (KF2A / 100) % 10;
            int KFL2S = KF2A % 10;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2B >= 1 && KFL2B <= 4) KTAB2 = 6 + KFL2A * (KFL2A - 2) + 2 * KFL2B + (KFL2S - 1) / 2;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2A == KFL2B) KTAB2--;
        }
        if (KTAB1 >= 0 && KTAB2 >= 0) skip = true;
    }

    // Parameters and breaking diquark parameter combinations.
    int KFL3A = 0;
    int KFLA = 0;
    int KFLB = 0;
    int KFLC = 0; 
    int KFS = 0;       
    bool repeat100 = false;
    do {
        repeat100 = false;
        if (skip == false) {
            double PAR2 = PARJ[1];
            double PAR3 = PARJ[2];
            double PAR4 = 3. * PARJ[3];
            double PAR3M = 0.;
            double PAR4M = 0.;
            double PARDM = 0.;
            double PARS0 = 0.;
            double PARS1 = 0.;
            double PARS2 = 0.;
            double PARSM = 0.;
            if (MSTJ[11] >= 2) {
                PAR3M = std::sqrt(PARJ[2]);
                PAR4M = 1. / (3. * std::sqrt(PARJ[3]));
                PARDM = PARJ[6] / (PARJ[6] + PAR3M * PARJ[5]);
                PARS0 = PARJ[4] * (2. + (1. + PAR2 * PAR3M * PARJ[6]) * (1. + PAR4M));
                PARS1 = PARJ[6] * PARS0 / (2. * PAR3M) + PARJ[4] * (PARJ[5] * (1. + PAR4M) + PAR2 * PAR3M * PARJ[5] * PARJ[6]);
                PARS2 = PARJ[4] * 2. * PARJ[5] * PARJ[6] * (PAR2 * PARJ[6] + (1. + PAR4M) / PAR3M);
                PARSM = std::max({PARS0, PARS1, PARS2});
                PAR4 = PAR4 * (1. + PARSM) / (1. + PARSM / (3. * PAR4M));
            }
     
            // Choice of whether to generate meson or baryon. 
            bool repeat110 = false;
            do {
                repeat110 = false;
                int MBARY = 0;
                int KFDA = 0;
                if (KF1A <= 10) {
                    if (KF2A == 0 && MSTJ[11] >= 1 && ((1. + PARJ[0]) * RLU()) > 1.) MBARY = 1;
                    if (KF2A > 10) MBARY = 2;
                    if (KF2A > 10 && KF2A <= 10000) KFDA = KF2A;
                } else {
                    MBARY = 2;
                    if (KF1A <= 10000) KFDA = KF1A;
                }

                // Possibility of process diquark -> meson + new diquark. 
                int KFLDS = 0;     
                if (KFDA != 0 && MSTJ[11] >= 2) {
                    int KFLDA = (KFDA / 1000) % 10;
                    int KFLDB = (KFDA / 100) % 10;
                    KFLDS = KFDA % 10;
                    double WTDQ = PARS0;
                    if (std::max(KFLDA, KFLDB) == 3) WTDQ = PARS1;
                    if (std::min(KFLDA, KFLDB) == 3) WTDQ = PARS2;
                    if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                    if ((1. + WTDQ) * RLU() > 1.) MBARY = -1;
                    if (MBARY == -1 && KF2A != 0) {output.push_back(KFL3); output.push_back(KF); return output;}
                }
         
                // Flavour for meson, possibly with new flavour. 
                int KFLS = 0;
                if (MBARY <= 0) {
                    KFS = (KFL1 < 0)? -1 : 1;
                    if (MBARY == 0) {
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        if (KF2A == 0) KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                        KFLA = std::max(KF1A, KF2A + std::abs(KFL3));
                        KFLB = std::min(KF1A, KF2A + std::abs(KFL3));
                        if (KFLA != KF1A) KFS = -KFS;
         
                    // Splitting of diquark into meson plus new diquark. 
                    } else {
                        int KFL1A = (KF1A / 1000) % 10;
                        int KFL1B = (KF1A / 100) % 10;
                        int KFL1D = 0;
                        int KFL1E = 0;
                        do {
                            KFL1D =  KFL1A + static_cast<int>(RLU() + 0.5) * (KFL1B - KFL1A);
                            KFL1E =  KFL1A + KFL1B - KFL1D;
                            if ((KFL1D == 3 && RLU() > PARDM) || (KFL1E == 3 && RLU() < PARDM)) {
                                KFL1D = KFL1A + KFL1B - KFL1D;
                                KFL1E = KFL1A + KFL1B - KFL1E;
                            }
                            KFL3A = 1 + static_cast<int>((2. + PAR2 * PAR3M * PARJ[6]) * RLU());
                        } while ((KFL1E != KFL3A && (RLU() > (1. + PAR4M) / std::max(2., 1. + PAR4M))) || (KFL1E == KFL3A && (RLU() > 2. / std::max(2., 1. + PAR4M))));
                        KFLDS = 3;
                        if (KFL1E != KFL3A) KFLDS = 2 * static_cast<int>(RLU() + 1. / (1. + PAR4M)) + 1;
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        KFL3 = (10000 + 1000 * std::max(KFL1E, KFL3A) + 100 * std::min(KFL1E, KFL3A) + KFLDS) * sgn;
                        KFLA = std::max(KFL1D, KFL3A);
                        KFLB = std::min(KFL1D, KFL3A);
                        if (KFLA != KFL1D) KFS = -KFS;
                    }
         
                    // Form meson, with spin and flavour mixing for diagonal states. 
                    int KMUL = 0;
                    if (KFLA <= 2) KMUL = static_cast<int>(PARJ[10] + RLU());
                    if (KFLA == 3) KMUL = static_cast<int>(PARJ[11] + RLU());
                    if (KFLA >= 4) KMUL = static_cast<int>(PARJ[12] + RLU());
                    if (KMUL == 0 && PARJ[13] > 0.) {
                        if (RLU() < PARJ[13]) KMUL = 2;
                    } else if (KMUL == 1 && PARJ[14] + PARJ[15] + PARJ[16] > 0.) {
                        double RMUL = RLU();
                        if (RMUL < PARJ[14]) KMUL = 3;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15]) KMUL = 4;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15] + PARJ[16]) KMUL = 5;
                    }
                    KFLS = 3;
                    if (KMUL == 0 || KMUL == 3) KFLS = 1;
                    if (KMUL == 5) KFLS = 5;
                    if (KFLA != KFLB) {
                        KF = (100 * KFLA + 10 * KFLB + KFLS) * KFS * std::pow(-1, KFLA);
                    } else {
                        double RMIX = RLU();
                        int IMIX = 2 * KFLA + 10 * KMUL;
                        if (KFLA <= 3) KF = 110 * (1 + static_cast<int>(RMIX + PARF[IMIX - 2]) + static_cast<int>(RMIX + PARF[IMIX - 1])) + KFLS;
                        if (KFLA >= 4) KF = 110 * KFLA + KFLS;
                    }
                    if (KMUL == 2 || KMUL == 3) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 10000 * sgn;
                    }
                    if (KMUL == 4) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 20000 * sgn;
                    }

                    // Optional extra suppression of eta and eta'.
                    if (KF == 221) {
                        if (RLU() > PARJ[24]) {repeat110 = true; continue;}
                    } else if (KF == 331) {
                        if (RLU() > PARJ[25]) {repeat110 = true; continue;}
                    }

                // Generate diquark flavour.
                } else {
                    double WT = 0.;
                    int KBARY = 0.;
                    do {
                        if (KF1A <= 10 && KF2A == 0) {
                            KFLA = KF1A;
                            do {
                                KFLB = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLC = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLDS = 1;
                                if (KFLB >= KFLC) KFLDS = 3;
                            } while ((KFLDS == 1 && PAR4 * RLU() > 1.) || (KFLDS == 3 && PAR4 < RLU()));
                            int sgn = (KFL1 < 0)? -1 : 1;
                            KFL3 = (1000 * std::max(KFLB, KFLC) + 100 * std::min(KFLB, KFLC) + KFLDS) * sgn;

                        // Take diquark flavour from input. 
                        } else if (KF1A <= 10) {
                            KFLA = KF1A;
                            KFLB = (KF2A / 1000) % 10;
                            KFLC = (KF2A / 100) % 10;
                            KFLDS = KF2A % 10;

                        // Generate (or take from input) quark to go with diquark. 
                        } else {
                            if (KF2A == 0) {
                                int sgn = (KFL1 < 0)? -1 : 1;
                                KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                            }
                            KFLA = KF2A + std::abs(KFL3);
                            KFLB = (KF1A / 1000) % 10;
                            KFLC = (KF1A / 100) % 10;
                            KFLDS = KF1A % 10;
                        }

                        // SU(6) factors for formation of baryon. Try again if fails. 
                        KBARY = KFLDS;
                        if (KFLDS == 3 && KFLB != KFLC) KBARY = 5;
                        if (KFLA != KFLB && KFLA != KFLC) KBARY++;
                        WT = PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY];
                        if (MBARY == 1 && MSTJ[11] >= 2) {
                            double WTDQ = PARS0;
                            if (std::max(KFLB, KFLC) == 3) WTDQ = PARS1;
                            if (std::min(KFLB, KFLC) == 3) WTDQ = PARS2;
                            if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                            if (KFLDS == 1) WT = WT * (1. + WTDQ) / (1. + PARSM / (3. * PAR4M));
                            if (KFLDS == 3) WT = WT * (1. + WTDQ) / (1. + PARSM);
                        }
                    } while (KF2A == 0 && WT < RLU());

                    // Form baryon. Distinguish Lambda- and Sigmalike baryons. 
                    int KFLD = std::max({KFLA, KFLB, KFLC});
                    int KFLF = std::min({KFLA, KFLB, KFLC});
                    int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
                    KFLS = 2;
                    if ((PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY]) * RLU() > PARF[59 + KBARY]) KFLS = 4;
                    int KFLL = 0;
                    if (KFLS == 2 && KFLD > KFLE && KFLE > KFLF) {
                        if (KFLDS == 1 && KFLA == KFLD) KFLL = 1;
                        if (KFLDS == 1 && KFLA != KFLD) KFLL = static_cast<int>(0.25 + RLU());
                        if (KFLDS == 3 && KFLA != KFLD) KFLL = static_cast<int>(0.75 + RLU());
                    }
                    if (KFLL == 0) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + KFLS) * sgn;
                    }
                    if (KFLL == 1) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + KFLS) * sgn;
                    }
                }

                output.push_back(KFL3);
                output.push_back(KF);
                return output;
            } while (repeat110);
        }  // end skip condition
        skip = false;

        // Use tabulated probabilities to select new flavour and hadron.
        int KT3L = KTAB2;
        int KT3U = KTAB2;
        if (KTAB2 == 0 && MSTJ[11] <= 0) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0 && KTAB1 >= 7 && MSTJ[11] <= 1) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0) {
            KT3L = 1;
            KT3U = 22;
        }
        double RFL = 0.;
        for (int KTS = 0; KTS < 3; ++KTS) {
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                RFL += PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
            }
        }
        RFL *= RLU();
        int KTABS = 0;
        int KTAB3 = 0;
        for (int KTS = 0; KTS < 3; ++KTS) {
            KTABS = KTS;
            bool breakLoop = false;
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                KTAB3 = KT3;
                RFL -= PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
                if (RFL <= 0.) {breakLoop = true; break;}
            }
            if (breakLoop) break;
        }

        // Reconstruct flavour of produced quark/diquark.
        int KFL3B = 0;
        if (KTAB3 <= 6) {
            KFL3A = KTAB3;
            KFL3B = 0;
            int sgn = (KFL1 * (2 * KTAB1 - 13) < 0)? -1 : 1;
            KFL3 = KFL3A * sgn;
        } else {
            KFL3A = 1;
            if (KTAB3 >= 8) KFL3A = 2;
            if (KTAB3 >= 11) KFL3A = 3;
            if (KTAB3 >= 16) KFL3A = 4;
            KFL3B = (KTAB3 - 6 - KFL3A * (KFL3A - 2)) / 2;
            KFL3 = 1000 * KFL3A + 100 * KFL3B + 1;
            if (KFL3A == KFL3B || KTAB3 != 6 + KFL3A * (KFL3A - 2) + 2 * KFL3B) KFL3 += 2;
            int sgn = (KFL1 * (13 - 2 * KTAB1) < 0)? -1 : 1;
            KFL3 = KFL3 * sgn;
        }

        // Reconstruct meson code. 
        if (KFL3A == KFL1A && KFL3B == KFL1B && (KFL3A <= 3 || KFL3B != 0)) {
            RFL = RLU() * (PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS -1] + PARF[145 + 80 * KTAB1 + 25 * KTABS - 1]);
            KF = 110 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 220 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 330 + 2 * KTABS + 1;
        } else if (KTAB1 <= 6 && KTAB3 <= 6) {
            KFLA = std::max(KTAB1, KTAB3);
            KFLB = std::min(KTAB1, KTAB3);
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFLA != KF1A) KFS = -KFS;
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);
        } else if (KTAB1 >= 7 && KTAB3 >= 7) {
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFL1A == KFL3A) {
                KFLA = std::max(KFL1B, KFL3B);
                KFLB = std::min(KFL1B, KFL3B);
                if (KFLA != KFL1B) KFS = -KFS;
            } else if (KFL1A == KFL3B) {
                KFLA = KFL3A;
                KFLB = KFL1B;
                KFS = -KFS;
            } else if (KFL1B == KFL3A) {
                KFLA = KFL1A;
                KFLB = KFL3B;
            } else if (KFL1B == KFL3B) {
                KFLA = std::max(KFL1A, KFL3A);
                KFLB = std::min(KFL1A, KFL3A);
                if (KFLA != KFL1A) KFS = -KFS;
            } else {
                LUERRM(2, "LUKFDI: no matching flavours for qq -> qq");
                repeat100 = true;
                continue;
            } 
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);

        // Reconstruct baryon code.
        } else {
            if (KTAB1 >= 7) {
                KFLA = KFL3A;
                KFLB = KFL1A;
                KFLC = KFL1B;
            } else {
                KFLA = KFL1A;
                KFLB = KFL3A;
                KFLC = KFL3B;
            }
            int KFLD = std::max({KFLA, KFLB, KFLC});
            int KFLF = std::min({KFLA, KFLB, KFLC});
            int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
            if (KTABS == 0) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + 2) * sgn;
            }
            if (KTABS >= 1) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + 2 * KTABS) * sgn;
            }
        }

        // Check that constructed flavour code is an allowed one.
        if (KFL2 != 0) KFL3 = 0;
        int KC = LUCOMP(KF);
        if (KC == 0) {
            LUERRM(2, "LUKFDI: user-defined flavour probabilities failed");
            repeat100 = true;
            continue;
        }
    } while (repeat100);
    
    output.push_back(KFL3);
    output.push_back(KF);
    return output;
}